

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

UBool __thiscall icu_63::RuleBasedTimeZone::hasSameRules(RuleBasedTimeZone *this,TimeZone *other)

{
  char *__s1;
  char *__s2;
  UBool UVar1;
  int iVar2;
  UBool UVar3;
  
  UVar3 = '\x01';
  if (this != (RuleBasedTimeZone *)other) {
    __s1 = *(char **)((this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1] + 8
                     );
    __s2 = *(char **)((other->super_UObject)._vptr_UObject[-1] + 8);
    if ((((__s1 != __s2) && ((*__s1 == '*' || (iVar2 = strcmp(__s1,__s2), iVar2 != 0)))) ||
        (iVar2 = (*(this->fInitialRule->super_TimeZoneRule).super_UObject._vptr_UObject[5])
                           (this->fInitialRule,other[1].super_UObject._vptr_UObject),
        (char)iVar2 != '\0')) ||
       ((UVar1 = compareRules(this->fHistoricRules,
                              (UVector *)other[1].fID.super_Replaceable.super_UObject._vptr_UObject)
        , UVar1 == '\0' ||
        (UVar1 = compareRules(this->fFinalRules,*(UVector **)&other[1].fID.fUnion), UVar1 == '\0')))
       ) {
      UVar3 = '\0';
    }
  }
  return UVar3;
}

Assistant:

UBool
RuleBasedTimeZone::hasSameRules(const TimeZone& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (typeid(*this) != typeid(other)) {
        return FALSE;
    }
    const RuleBasedTimeZone& that = (const RuleBasedTimeZone&)other;
    if (*fInitialRule != *(that.fInitialRule)) {
        return FALSE;
    }
    if (compareRules(fHistoricRules, that.fHistoricRules)
        && compareRules(fFinalRules, that.fFinalRules)) {
        return TRUE;
    }
    return FALSE;
}